

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int unpack(lua_State *L)

{
  int iVar1;
  int n_00;
  long local_38;
  lua_Integer e;
  lua_Integer i;
  lua_Unsigned n;
  lua_State *L_local;
  
  e = luaL_optinteger(L,2,1);
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    local_38 = luaL_len(L,1);
  }
  else {
    local_38 = luaL_checkinteger(L,3);
  }
  if (local_38 < e) {
    L_local._4_4_ = 0;
  }
  else {
    if ((ulong)(local_38 - e) < 0x7fffffff) {
      n_00 = (int)(local_38 - e) + 1;
      iVar1 = lua_checkstack(L,n_00);
      if (iVar1 != 0) {
        for (; e < local_38; e = e + 1) {
          lua_geti(L,1,e);
        }
        lua_geti(L,1,local_38);
        return n_00;
      }
    }
    L_local._4_4_ = luaL_error(L,"too many results to unpack");
  }
  return L_local._4_4_;
}

Assistant:

static int unpack(lua_State *L) {
    lua_Unsigned n;
    lua_Integer i = luaL_optinteger(L, 2, 1);
    lua_Integer e = luaL_opt(L, luaL_checkinteger, 3, luaL_len(L, 1));
    if (i > e) return 0;  /* empty range */
    n = (lua_Unsigned) e - i;  /* number of elements minus 1 (avoid overflows) */
    if (n >= (unsigned int) INT_MAX || !lua_checkstack(L, (int) (++n)))
        return luaL_error(L, "too many results to unpack");
    for (; i < e; i++) {  /* push arg[i..e - 1] (to avoid overflows) */
        lua_geti(L, 1, i);
    }
    lua_geti(L, 1, e);  /* push last element */
    return (int) n;
}